

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttobjs.c
# Opt level: O2

FT_Error tt_size_reset(TT_Size size,FT_Bool only_height)

{
  FT_Face pFVar1;
  byte *pbVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  FT_Pos FVar5;
  FT_Pos FVar6;
  FT_Pos FVar7;
  FT_UShort FVar8;
  undefined4 uVar9;
  FT_Error FVar10;
  long lVar11;
  FT_Long FVar12;
  long lVar13;
  uint uVar14;
  ushort uVar15;
  uint uVar16;
  uint uVar17;
  byte *pbVar18;
  ushort uVar19;
  
  pFVar1 = (size->root).face;
  FVar10 = 0;
  if (*(char *)&pFVar1[4].autohint.data == '\0') {
    (size->ttmetrics).valid = '\0';
    FVar8 = (size->root).metrics.y_ppem;
    uVar9 = *(undefined4 *)&(size->root).metrics.field_0x4;
    FVar3 = (size->root).metrics.x_scale;
    FVar4 = (size->root).metrics.y_scale;
    FVar5 = (size->root).metrics.ascender;
    FVar6 = (size->root).metrics.descender;
    FVar7 = (size->root).metrics.height;
    (size->hinted_metrics).x_ppem = (size->root).metrics.x_ppem;
    (size->hinted_metrics).y_ppem = FVar8;
    *(undefined4 *)&(size->hinted_metrics).field_0x4 = uVar9;
    (size->hinted_metrics).x_scale = FVar3;
    (size->hinted_metrics).y_scale = FVar4;
    (size->hinted_metrics).ascender = FVar5;
    (size->hinted_metrics).descender = FVar6;
    (size->hinted_metrics).height = FVar7;
    (size->hinted_metrics).max_advance = (size->root).metrics.max_advance;
    uVar15 = (size->hinted_metrics).x_ppem;
    FVar10 = 0x97;
    if ((uVar15 != 0) && (uVar19 = (size->hinted_metrics).y_ppem, uVar19 != 0)) {
      if (((ulong)pFVar1[1].generic.data & 8) == 0) {
        (size->ttmetrics).valid = '\x01';
        if (only_height != '\0') {
          return 0;
        }
      }
      else {
        lVar11 = (long)(int)(size->hinted_metrics).y_scale;
        lVar13 = pFVar1->ascender * lVar11;
        (size->hinted_metrics).ascender =
             ((lVar13 >> 0x3f) + lVar13) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        lVar13 = pFVar1->descender * lVar11;
        (size->hinted_metrics).descender =
             ((lVar13 >> 0x3f) + lVar13) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        lVar11 = pFVar1->height * lVar11;
        (size->hinted_metrics).height =
             ((lVar11 >> 0x3f) + lVar11) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        (size->ttmetrics).valid = '\x01';
        if (only_height != '\0') {
          return 0;
        }
        FVar12 = FT_DivFix((ulong)uVar15 << 6,(ulong)pFVar1->units_per_EM);
        (size->hinted_metrics).x_scale = FVar12;
        FVar12 = FT_DivFix((ulong)(size->hinted_metrics).y_ppem << 6,(ulong)pFVar1->units_per_EM);
        (size->hinted_metrics).y_scale = FVar12;
        lVar11 = (long)(int)(size->hinted_metrics).x_scale * (long)pFVar1->max_advance_width;
        (size->hinted_metrics).max_advance =
             ((lVar11 >> 0x3f) + lVar11) * 0x10000 + 0x2080000000 >> 0x20 & 0xffffffffffffffc0;
        uVar15 = (size->hinted_metrics).x_ppem;
        uVar19 = (size->hinted_metrics).y_ppem;
      }
      if (uVar15 < uVar19) {
        (size->ttmetrics).scale = (size->hinted_metrics).y_scale;
        (size->ttmetrics).ppem = uVar19;
        FVar12 = FT_DivFix((ulong)uVar15,(ulong)uVar19);
        (size->ttmetrics).x_ratio = FVar12;
        FVar12 = 0x10000;
      }
      else {
        (size->ttmetrics).scale = (size->hinted_metrics).x_scale;
        (size->ttmetrics).ppem = uVar15;
        (size->ttmetrics).x_ratio = 0x10000;
        FVar12 = FT_DivFix((ulong)uVar19,(ulong)uVar15);
      }
      (size->ttmetrics).y_ratio = FVar12;
      uVar15 = (size->hinted_metrics).x_ppem;
      pbVar18 = (byte *)0x0;
      uVar17 = 0;
      uVar16 = pFVar1[5].num_fixed_sizes;
      while (uVar14 = uVar16, uVar17 < uVar14) {
        uVar16 = uVar17 + uVar14 >> 1;
        pbVar2 = *(byte **)(*(long *)&pFVar1[5].num_charmaps + (ulong)uVar16 * 8);
        uVar19 = (ushort)*pbVar2;
        if (uVar19 <= uVar15) {
          if (uVar15 <= uVar19) {
            pbVar18 = pbVar2 + 2;
            break;
          }
          uVar17 = uVar16 + 1;
          uVar16 = uVar14;
        }
      }
      size->widthp = pbVar18;
      size->metrics = &size->hinted_metrics;
      size->cvt_ready = -1;
      FVar10 = 0;
    }
  }
  return FVar10;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_size_reset( TT_Size  size,
                 FT_Bool  only_height )
  {
    TT_Face           face;
    FT_Size_Metrics*  size_metrics;


    face = (TT_Face)size->root.face;

    /* nothing to do for CFF2 */
    if ( face->is_cff2 )
      return FT_Err_Ok;

    size->ttmetrics.valid = FALSE;

    size_metrics = &size->hinted_metrics;

    /* copy the result from base layer */
    *size_metrics = size->root.metrics;

    if ( size_metrics->x_ppem < 1 || size_metrics->y_ppem < 1 )
      return FT_THROW( Invalid_PPem );

    /* This bit flag, if set, indicates that the ppems must be       */
    /* rounded to integers.  Nearly all TrueType fonts have this bit */
    /* set, as hinting won't work really well otherwise.             */
    /*                                                               */
    if ( face->header.Flags & 8 )
    {
      /* the TT spec always asks for ROUND, not FLOOR or CEIL */
      size_metrics->ascender = FT_PIX_ROUND(
                                 FT_MulFix( face->root.ascender,
                                            size_metrics->y_scale ) );
      size_metrics->descender = FT_PIX_ROUND(
                                 FT_MulFix( face->root.descender,
                                            size_metrics->y_scale ) );
      size_metrics->height = FT_PIX_ROUND(
                               FT_MulFix( face->root.height,
                                          size_metrics->y_scale ) );
    }

    size->ttmetrics.valid = TRUE;

    if ( only_height )
    {
      /* we must not recompute the scaling values here since       */
      /* `tt_size_reset' was already called (with only_height = 0) */
      return FT_Err_Ok;
    }

    if ( face->header.Flags & 8 )
    {
      /* base scaling values on integer ppem values, */
      /* as mandated by the TrueType specification   */
      size_metrics->x_scale = FT_DivFix( size_metrics->x_ppem << 6,
                                         face->root.units_per_EM );
      size_metrics->y_scale = FT_DivFix( size_metrics->y_ppem << 6,
                                         face->root.units_per_EM );

      size_metrics->max_advance = FT_PIX_ROUND(
                                    FT_MulFix( face->root.max_advance_width,
                                               size_metrics->x_scale ) );
    }

    /* compute new transformation */
    if ( size_metrics->x_ppem >= size_metrics->y_ppem )
    {
      size->ttmetrics.scale   = size_metrics->x_scale;
      size->ttmetrics.ppem    = size_metrics->x_ppem;
      size->ttmetrics.x_ratio = 0x10000L;
      size->ttmetrics.y_ratio = FT_DivFix( size_metrics->y_ppem,
                                           size_metrics->x_ppem );
    }
    else
    {
      size->ttmetrics.scale   = size_metrics->y_scale;
      size->ttmetrics.ppem    = size_metrics->y_ppem;
      size->ttmetrics.x_ratio = FT_DivFix( size_metrics->x_ppem,
                                           size_metrics->y_ppem );
      size->ttmetrics.y_ratio = 0x10000L;
    }

    size->widthp = tt_face_get_device_metrics( face, size_metrics->x_ppem, 0 );

    size->metrics = size_metrics;

#ifdef TT_USE_BYTECODE_INTERPRETER
    size->cvt_ready = -1;
#endif /* TT_USE_BYTECODE_INTERPRETER */

    return FT_Err_Ok;
  }